

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFOBSFireFightingGraph.cpp
# Opt level: O2

Scope * __thiscall
ProblemFOBSFireFightingGraph::GetHousesAgentInfluences
          (Scope *__return_storage_ptr__,ProblemFOBSFireFightingGraph *this,Index agI)

{
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Scope::Insert(__return_storage_ptr__,agI);
  Scope::Insert(__return_storage_ptr__,agI + 1);
  return __return_storage_ptr__;
}

Assistant:

Scope ProblemFOBSFireFightingGraph::GetHousesAgentInfluences(Index agI) const
{
    Scope houses;
    // agent's actions only influence two houses
    houses.Insert(agI);
    houses.Insert(agI+1);
    return(houses);
}